

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cc
# Opt level: O1

int __thiscall
draco::PointCloud::AddAttribute
          (PointCloud *this,GeometryAttribute *att,bool identity_mapping,
          ValueType num_attribute_values)

{
  int iVar1;
  undefined7 in_register_00000011;
  unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> pa;
  _Head_base<0UL,_draco::PointAttribute_*,_false> local_20;
  PointAttribute *local_18;
  
  CreateAttribute((PointCloud *)&stack0xffffffffffffffe8,(GeometryAttribute *)this,SUB81(att,0),
                  (ValueType)CONCAT71(in_register_00000011,identity_mapping));
  if (local_18 == (PointAttribute *)0x0) {
    iVar1 = -1;
  }
  else {
    local_20._M_head_impl = local_18;
    local_18 = (PointAttribute *)0x0;
    iVar1 = AddAttribute(this,(unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                               *)&local_20);
    if (local_20._M_head_impl != (PointAttribute *)0x0) {
      std::default_delete<draco::PointAttribute>::operator()
                ((default_delete<draco::PointAttribute> *)&local_20,local_20._M_head_impl);
    }
    local_20._M_head_impl = (PointAttribute *)0x0;
  }
  if (local_18 != (PointAttribute *)0x0) {
    std::default_delete<draco::PointAttribute>::operator()
              ((default_delete<draco::PointAttribute> *)&stack0xffffffffffffffe8,local_18);
  }
  return iVar1;
}

Assistant:

int PointCloud::AddAttribute(
    const GeometryAttribute &att, bool identity_mapping,
    AttributeValueIndex::ValueType num_attribute_values) {
  auto pa = CreateAttribute(att, identity_mapping, num_attribute_values);
  if (!pa) {
    return -1;
  }
  const int32_t att_id = AddAttribute(std::move(pa));
  return att_id;
}